

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cylinder.cpp
# Opt level: O1

void __thiscall
geometry::primitive::Cylinder::Cylinder
          (Cylinder *this,Matrix4d *transformation,shared_ptr<material::Material> *material,
          double minimum,double maximum,bool closed)

{
  shared_ptr<material::Material> local_30;
  double local_20;
  double local_18;
  
  local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_20 = minimum;
  local_18 = maximum;
  Primitive::Primitive(&this->super_Primitive,transformation,&local_30);
  if (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_transform_00115828;
  this->m_minmax[0] = local_20;
  this->m_minmax[1] = local_18;
  this->m_closed = closed;
  return;
}

Assistant:

geometry::primitive::Cylinder::Cylinder(const math::Matrix4d &transformation, std::shared_ptr<material::Material> material, double minimum, double maximum, bool closed) :
    Primitive(transformation, material),
    m_minmax{minimum, maximum},
    m_closed{closed}
{}